

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O3

void __thiscall FIX::FileStore::reset(FileStore *this,UtcTimeStamp *now)

{
  int64_t iVar1;
  undefined4 uVar2;
  int __oflag;
  
  (this->m_cache).m_nextSenderMsgSeqNum = 1;
  (this->m_cache).m_nextTargetMsgSeqNum = 1;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_cache).m_messages._M_t);
  uVar2 = *(undefined4 *)&(now->super_DateTime).field_0xc;
  iVar1 = (now->super_DateTime).m_time;
  (this->m_cache).m_creationTime.super_DateTime.m_date = (now->super_DateTime).m_date;
  *(undefined4 *)&(this->m_cache).m_creationTime.super_DateTime.field_0xc = uVar2;
  (this->m_cache).m_creationTime.super_DateTime.m_time = iVar1;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
  ::clear(&(this->m_offsets)._M_t);
  open(this,(char *)0x1,__oflag);
  setSession(this);
  return;
}

Assistant:

EXCEPT(IOException) {
  try {
    m_cache.reset(now);
    m_offsets.clear();
    open(true);
    setSession();
  } catch (std::exception &e) {
    throw IOException(e.what());
  }
}